

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O0

void __thiscall
QFragmentMapData<QTextFragmentData>::rotateRight(QFragmentMapData<QTextFragmentData> *this,uint x)

{
  uint index;
  uint index_00;
  quint32 qVar1;
  quint32 qVar2;
  bool bVar3;
  QTextFragmentData *pQVar4;
  uint in_ESI;
  anon_union_8_2_e778645c_for_QFragmentMapData<QTextFragmentData>_1 *in_RDI;
  uint field;
  uint p;
  uint y;
  
  pQVar4 = F((QFragmentMapData<QTextFragmentData> *)in_RDI,in_ESI);
  index = (pQVar4->super_QFragment<1>).left;
  pQVar4 = F((QFragmentMapData<QTextFragmentData> *)in_RDI,in_ESI);
  index_00 = (pQVar4->super_QFragment<1>).parent;
  if (index == 0) {
    pQVar4 = F((QFragmentMapData<QTextFragmentData> *)in_RDI,in_ESI);
    (pQVar4->super_QFragment<1>).left = 0;
  }
  else {
    pQVar4 = F((QFragmentMapData<QTextFragmentData> *)in_RDI,index);
    qVar1 = (pQVar4->super_QFragment<1>).right;
    pQVar4 = F((QFragmentMapData<QTextFragmentData> *)in_RDI,in_ESI);
    (pQVar4->super_QFragment<1>).left = qVar1;
    pQVar4 = F((QFragmentMapData<QTextFragmentData> *)in_RDI,index);
    if ((pQVar4->super_QFragment<1>).right != 0) {
      pQVar4 = F((QFragmentMapData<QTextFragmentData> *)in_RDI,index);
      pQVar4 = F((QFragmentMapData<QTextFragmentData> *)in_RDI,(pQVar4->super_QFragment<1>).right);
      (pQVar4->super_QFragment<1>).parent = in_ESI;
    }
    pQVar4 = F((QFragmentMapData<QTextFragmentData> *)in_RDI,index);
    (pQVar4->super_QFragment<1>).right = in_ESI;
    pQVar4 = F((QFragmentMapData<QTextFragmentData> *)in_RDI,index);
    (pQVar4->super_QFragment<1>).parent = index_00;
  }
  if (index_00 == 0) {
    in_RDI->head->root = index;
  }
  else {
    pQVar4 = F((QFragmentMapData<QTextFragmentData> *)in_RDI,index_00);
    if (in_ESI == (pQVar4->super_QFragment<1>).right) {
      pQVar4 = F((QFragmentMapData<QTextFragmentData> *)in_RDI,index_00);
      (pQVar4->super_QFragment<1>).right = index;
    }
    else {
      pQVar4 = F((QFragmentMapData<QTextFragmentData> *)in_RDI,index_00);
      (pQVar4->super_QFragment<1>).left = index;
    }
  }
  pQVar4 = F((QFragmentMapData<QTextFragmentData> *)in_RDI,in_ESI);
  (pQVar4->super_QFragment<1>).parent = index;
  bVar3 = false;
  while (!bVar3) {
    pQVar4 = F((QFragmentMapData<QTextFragmentData> *)in_RDI,index);
    qVar1 = (pQVar4->super_QFragment<1>).size_left_array[0];
    pQVar4 = F((QFragmentMapData<QTextFragmentData> *)in_RDI,index);
    qVar2 = (pQVar4->super_QFragment<1>).size_array[0];
    pQVar4 = F((QFragmentMapData<QTextFragmentData> *)in_RDI,in_ESI);
    (pQVar4->super_QFragment<1>).size_left_array[0] =
         (pQVar4->super_QFragment<1>).size_left_array[0] - (qVar1 + qVar2);
    bVar3 = true;
  }
  return;
}

Assistant:

void QFragmentMapData<Fragment>::rotateRight(uint x)
{
    uint y = F(x).left;
    uint p = F(x).parent;

    if (y) {
        F(x).left = F(y).right;
        if (F(y).right)
            F(F(y).right).parent = x;
        F(y).right = x;
        F(y).parent = p;
    } else {
        F(x).left = 0;
    }
    if (!p) {
        Q_ASSERT(head->root == x);
        head->root = y;
    }
    else if (x == F(p).right)
        F(p).right = y;
    else
        F(p).left = y;
    F(x).parent = y;
    for (uint field = 0; field < Fragment::size_array_max; ++field)
        F(x).size_left_array[field] -= F(y).size_left_array[field] + F(y).size_array[field];
}